

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void endElementNsDebug(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  xmlChar *URI_local;
  xmlChar *prefix_local;
  xmlChar *localname_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (quiet == 0) {
    fprintf((FILE *)SAXdebug,"SAX.endElementNs(%s",localname);
    if (prefix == (xmlChar *)0x0) {
      fprintf((FILE *)SAXdebug,", NULL");
    }
    else {
      fprintf((FILE *)SAXdebug,", %s",prefix);
    }
    if (URI == (xmlChar *)0x0) {
      fprintf((FILE *)SAXdebug,", NULL)\n");
    }
    else {
      fprintf((FILE *)SAXdebug,", \'%s\')\n",URI);
    }
  }
  return;
}

Assistant:

static void
endElementNsDebug(void *ctx ATTRIBUTE_UNUSED,
                  const xmlChar *localname,
                  const xmlChar *prefix,
                  const xmlChar *URI)
{
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.endElementNs(%s", (char *) localname);
    if (prefix == NULL)
	fprintf(SAXdebug, ", NULL");
    else
	fprintf(SAXdebug, ", %s", (char *) prefix);
    if (URI == NULL)
	fprintf(SAXdebug, ", NULL)\n");
    else
	fprintf(SAXdebug, ", '%s')\n", (char *) URI);
}